

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group_Type.cxx
# Opt level: O0

void __thiscall Fl_Table_Type::add_child(Fl_Table_Type *this,Fl_Type *cc,Fl_Type *before)

{
  int iVar1;
  Fl_Type *local_40;
  Fl_Widget *b;
  Fl_Widget_Type *c;
  Fl_Type *before_local;
  Fl_Type *cc_local;
  Fl_Table_Type *this_local;
  
  if (before == (Fl_Type *)0x0) {
    local_40 = (Fl_Type *)0x0;
  }
  else {
    local_40 = before[1].prev;
  }
  iVar1 = Fl_Table::children((Fl_Table *)(this->super_Fl_Group_Type).super_Fl_Widget_Type.o);
  if (iVar1 == 1) {
    fl_message(
              "Inserting child widgets into an Fl_Table is not recommended.\nPlease refer to the documentation on Fl_Table."
              );
  }
  Fl_Table::insert((Fl_Table *)(this->super_Fl_Group_Type).super_Fl_Widget_Type.o,
                   (Fl_Widget *)cc[1].prev,(Fl_Widget *)local_40);
  Fl_Widget::redraw((this->super_Fl_Group_Type).super_Fl_Widget_Type.o);
  return;
}

Assistant:

void Fl_Table_Type::add_child(Fl_Type* cc, Fl_Type* before) {
  Fl_Widget_Type* c = (Fl_Widget_Type*)cc;
  Fl_Widget* b = before ? ((Fl_Widget_Type*)before)->o : 0;
  if (((Fl_Table*)o)->children()==1) { // the FLuid_Table has one extra child
    fl_message("Inserting child widgets into an Fl_Table is not recommended.\n"
               "Please refer to the documentation on Fl_Table.");
  }
  ((Fl_Table*)o)->insert(*(c->o), b);
  o->redraw();
}